

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameTest_RFC2253FormatInvalidOid_Test::TestBody
          (ParseNameTest_RFC2253FormatInvalidOid_Test *this)

{
  Input name_tlv;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  string output;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  uchar *local_88;
  uchar *puStack_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  RDNSequence rdn;
  undefined1 auStack_38 [8];
  Input rdn_input;
  uint8_t der [24];
  ParseNameTest_RFC2253FormatInvalidOid_Test *this_local;
  
  rdn_input.data_.size_ = 0xa06123014311630;
  Span<unsigned_char_const>::Span<24ul>
            ((Span<unsigned_char_const> *)
             &rdn.
              super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uchar (*) [24])&rdn_input.data_.size_);
  bssl::der::Input::Input((Input *)auStack_38,stack0xffffffffffffffb8);
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
            *)&gtest_ar_.message_);
  local_88 = (uchar *)auStack_38;
  puStack_80 = rdn_input.data_.data_;
  name_tlv.data_.size_ = (size_t)rdn_input.data_.data_;
  name_tlv.data_.data_ = (uchar *)auStack_38;
  local_71 = ParseName(name_tlv,(RDNSequence *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_70,(AssertionResult *)"ParseName(rdn_input, &rdn)",
               "false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x167,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&gtest_ar__1.message_);
    bVar1 = ConvertToRFC2253((RDNSequence *)&gtest_ar_.message_,(string *)&gtest_ar__1.message_);
    local_101 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_100,&local_101,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_138,(internal *)local_100,
                 (AssertionResult *)"ConvertToRFC2253(rdn, &output)","true","false",in_R9);
      pcVar2 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                 ,0x169,pcVar2);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      ::std::__cxx11::string::~string((string *)&local_138);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    ::std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  }
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::~vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
             *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ParseNameTest, RFC2253FormatInvalidOid) {
  // Same DER as RFC2253FormatLargeOid but with the last byte of the OID
  // replaced with 0x80, which ends the OID with a truncated multi-byte
  // component.
  const uint8_t der[] = {0x30, 0x16, 0x31, 0x14, 0x30, 0x12, 0x06, 0x0a,
                         0x81, 0x0d, 0x06, 0x01, 0x99, 0x21, 0x01, 0x8b,
                         0x3a, 0x80, 0x13, 0x04, 0x74, 0x65, 0x73, 0x74};
  der::Input rdn_input(der);
  RDNSequence rdn;
  ASSERT_TRUE(ParseName(rdn_input, &rdn));
  std::string output;
  EXPECT_FALSE(ConvertToRFC2253(rdn, &output));
}